

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Reach.c
# Opt level: O2

int Llb_ManReachability(Llb_Man_t *p,Vec_Int_t *vHints,DdManager **pddGlo)

{
  int *Permute;
  int *Permute_00;
  int *Permute_01;
  Vec_Ptr_t *pVVar1;
  FILE *pFVar2;
  int iVar3;
  uint uVar4;
  abctime aVar5;
  abctime aVar6;
  long lVar7;
  DdManager *pDVar8;
  DdNode *pDVar9;
  DdNode *n;
  DdNode *n_00;
  DdNode *n_01;
  abctime aVar10;
  DdNode *pDVar11;
  void **ppvVar12;
  Llb_Grp_t *pGroup;
  DdNode *pDVar13;
  DdNode *n_02;
  Gia_ParLlb_t *pGVar14;
  Abc_Cex_t *pAVar15;
  uint uVar16;
  Aig_Man_t *pAVar17;
  int iGrpPlace;
  abctime time;
  abctime time_00;
  char *pcVar18;
  int level;
  Llb_Man_t *pLVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  uint local_84;
  
  Permute = p->vNs2Glo->pArray;
  Permute_00 = p->vCs2Glo->pArray;
  Permute_01 = p->vGlo2Cs->pArray;
  aVar5 = Abc_Clock();
  pGVar14 = p->pPars;
  iVar3 = pGVar14->TimeLimit;
  if ((long)iVar3 == 0) {
    lVar7 = 0;
  }
  else {
    aVar6 = Abc_Clock();
    lVar7 = aVar6 + (long)iVar3 * 1000000;
    pGVar14 = p->pPars;
  }
  pGVar14->TimeTarget = lVar7;
  Llb_ManPrepareVarLimits(p);
  if (p->dd != (DdManager *)0x0) {
    __assert_fail("p->dd == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,600,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddG != (DdManager *)0x0) {
    __assert_fail("p->ddG == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x259,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  if (p->ddR != (DdManager *)0x0) {
    __assert_fail("p->ddR == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                  ,0x25a,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
  }
  pDVar8 = Cudd_Init(p->vVar2Obj->nSize,0,0x100,0x40000,0);
  p->dd = pDVar8;
  pDVar8 = Cudd_Init(p->pAig->nObjs[2],0,0x100,0x40000,0);
  p->ddR = pDVar8;
  if ((pddGlo == (DdManager **)0x0) || (*pddGlo == (DdManager *)0x0)) {
    pDVar8 = Cudd_Init(p->pAig->nRegs,0,0x100,0x40000,0);
    p->ddG = pDVar8;
  }
  else {
    p->ddG = *pddGlo;
    *pddGlo = (DdManager *)0x0;
  }
  if (p->pPars->fReorder == 0) {
    Cudd_AutodynDisable(p->dd);
    Cudd_AutodynDisable(p->ddG);
    Cudd_AutodynDisable(p->ddR);
  }
  else {
    Cudd_AutodynEnable(p->dd,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddG,CUDD_REORDER_SYMM_SIFT);
    Cudd_AutodynEnable(p->ddR,CUDD_REORDER_SYMM_SIFT);
  }
  aVar6 = p->pPars->TimeTarget;
  p->dd->TimeStop = aVar6;
  p->ddG->TimeStop = aVar6;
  pDVar8 = p->ddR;
  pDVar8->TimeStop = aVar6;
  pDVar9 = Llb_BddComputeBad(p->pAigGlo,pDVar8,aVar6);
  p->ddR->bFunc = pDVar9;
  if (pDVar9 == (DdNode *)0x0) {
    pGVar14 = p->pPars;
    if (pGVar14->fSilent == 0) {
      printf("Reached timeout (%d seconds) during constructing the bad states.\n",
             (ulong)(uint)pGVar14->TimeLimit);
      pGVar14 = p->pPars;
    }
    pGVar14->iFrame = -1;
  }
  else {
    Cudd_Ref(pDVar9);
    n = Llb_ManCreateConstraints(p,vHints,0);
    Cudd_Ref(n);
    n_00 = Llb_ManCreateConstraints(p,vHints,1);
    Cudd_Ref(n_00);
    pDVar8 = p->ddG;
    pDVar9 = pDVar8->bFunc;
    if (pDVar9 == (DdNode *)0x0) {
      pDVar9 = Llb_ManComputeInitState(p,pDVar8);
      Cudd_Ref(pDVar9);
      n_01 = Llb_ManComputeInitState(p,p->dd);
    }
    else {
      pDVar8->bFunc = (DdNode *)0x0;
      n_01 = Extra_TransferPermute(pDVar8,p->dd,pDVar9,Permute_01);
    }
    Cudd_Ref(n_01);
    local_84 = 0;
    uVar20 = 0xffffffff;
    while (uVar16 = uVar20 + 1, pDVar11 = n_01, (int)uVar16 < p->pPars->nIterMax) {
      aVar6 = Abc_Clock();
      if (p->pPars->TimeLimit != 0) {
        aVar10 = Abc_Clock();
        pGVar14 = p->pPars;
        if (aVar10 <= pGVar14->TimeTarget) goto LAB_006931a8;
        if (pGVar14->fSilent == 0) {
          printf("Reached timeout during image computation (%d seconds).\n",
                 (ulong)(uint)pGVar14->TimeLimit);
          pGVar14 = p->pPars;
        }
        pGVar14->iFrame = uVar20;
LAB_006937cc:
        pDVar8 = p->dd;
LAB_006937d3:
        Cudd_RecursiveDeref(pDVar8,n_01);
        Cudd_RecursiveDeref(p->dd,n);
        Cudd_RecursiveDeref(p->dd,n_00);
        goto LAB_006937f4;
      }
LAB_006931a8:
      pDVar11 = Extra_TransferPermute(p->dd,p->ddR,n_01,Permute_00);
      if (pDVar11 == (DdNode *)0x0) {
        pGVar14 = p->pPars;
        if (pGVar14->fSilent == 0) {
          printf("Reached timeout (%d seconds) during ring transfer.\n",
                 (ulong)(uint)pGVar14->TimeLimit);
          pGVar14 = p->pPars;
        }
        pGVar14->iFrame = uVar20;
        goto LAB_006937cc;
      }
      Cudd_Ref(pDVar11);
      pVVar1 = p->vRings;
      iVar3 = pVVar1->nSize;
      if (iVar3 == pVVar1->nCap) {
        uVar4 = iVar3 * 2;
        if (iVar3 < 0x10) {
          uVar4 = 0x10;
        }
        if (iVar3 < (int)uVar4) {
          if (pVVar1->pArray == (void **)0x0) {
            ppvVar12 = (void **)malloc((ulong)uVar4 << 3);
          }
          else {
            ppvVar12 = (void **)realloc(pVVar1->pArray,(ulong)uVar4 << 3);
            iVar3 = pVVar1->nSize;
          }
          pVVar1->pArray = ppvVar12;
          pVVar1->nCap = uVar4;
        }
      }
      pVVar1->nSize = iVar3 + 1;
      pVVar1->pArray[iVar3] = pDVar11;
      if (p->pPars->fSkipOutCheck == 0) {
        pDVar8 = p->ddR;
        iVar3 = Cudd_bddLeq(pDVar8,pDVar11,(DdNode *)((ulong)pDVar8->bFunc ^ 1));
        level = (int)pDVar8;
        if (iVar3 == 0) {
          pAVar17 = p->pAigGlo;
          if (pAVar17->pSeqModel == (Abc_Cex_t *)0x0) {
            pGVar14 = p->pPars;
            if (pGVar14->fBackward == 0) {
              pLVar19 = p;
              pAVar15 = Llb_ManReachDeriveCex(p);
              level = (int)pLVar19;
              pAVar17 = p->pAigGlo;
              pAVar17->pSeqModel = pAVar15;
              pGVar14 = p->pPars;
            }
            else {
              pAVar15 = (Abc_Cex_t *)0x0;
            }
            if (pGVar14->fSilent == 0) {
              if (pGVar14->fBackward == 0) {
                pcVar18 = "Output %d of miter \"%s\" was asserted in frame %d.  ";
                Abc_Print(level,"Output %d of miter \"%s\" was asserted in frame %d.  ",
                          (ulong)(uint)pAVar15->iPo,pAVar17->pName,pAVar17->pName);
              }
              else {
                pcVar18 = 
                "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  "
                ;
                Abc_Print(level,
                          "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  "
                          ,pAVar17->pName,(ulong)(uVar20 + 1));
              }
              aVar6 = Abc_Clock();
              Abc_PrintTime((int)aVar6 - (int)aVar5,pcVar18,time_00);
              pGVar14 = p->pPars;
            }
            pGVar14->iFrame = uVar20;
            Cudd_RecursiveDeref(p->dd,n_01);
            Cudd_RecursiveDeref(p->dd,n);
            Cudd_RecursiveDeref(p->dd,n_00);
            Cudd_RecursiveDeref(p->ddG,pDVar9);
            return 0;
          }
          __assert_fail("p->pAigGlo->pSeqModel == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x2b8,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
        }
      }
      pDVar11 = n_01;
      if (vHints != (Vec_Int_t *)0x0) {
        pDVar11 = Cudd_bddAnd(p->dd,n_01,n);
        Cudd_Ref(pDVar11);
        Cudd_RecursiveDeref(p->dd,n_01);
      }
      pGroup = (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,0);
      pDVar13 = Llb_ManConstructQuantCubeIntern(p,pGroup,iGrpPlace,0);
      Cudd_Ref(pDVar13);
      n_01 = Cudd_bddExistAbstract(p->dd,pDVar11,pDVar13);
      Cudd_Ref(n_01);
      Cudd_RecursiveDeref(p->dd,pDVar11);
      Cudd_RecursiveDeref(p->dd,pDVar13);
      pDVar11 = Llb_ManComputeImage(p,n_01,0);
      if (pDVar11 == (DdNode *)0x0) {
        pGVar14 = p->pPars;
        if (pGVar14->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation.\n",
                 (ulong)(uint)pGVar14->TimeLimit);
          pGVar14 = p->pPars;
        }
        pGVar14->iFrame = uVar20;
        pDVar8 = p->dd;
        goto LAB_006937d3;
      }
      Cudd_Ref(pDVar11);
      Cudd_RecursiveDeref(p->dd,n_01);
      n_01 = pDVar11;
      if (vHints != (Vec_Int_t *)0x0) {
        n_01 = Cudd_bddAnd(p->dd,pDVar11,n_00);
        Cudd_Ref(n_01);
        Cudd_RecursiveDeref(p->dd,pDVar11);
      }
      pDVar13 = Extra_TransferPermute(p->dd,p->ddG,n_01,Permute);
      if (pDVar13 == (DdNode *)0x0) {
        pGVar14 = p->pPars;
        if (pGVar14->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation in transfer 1.\n",
                 (ulong)(uint)pGVar14->TimeLimit);
          pGVar14 = p->pPars;
        }
        pGVar14->iFrame = uVar20;
        pDVar8 = p->dd;
        goto LAB_006937d3;
      }
      Cudd_Ref(pDVar13);
      Cudd_RecursiveDeref(p->dd,n_01);
      iVar3 = Cudd_bddLeq(p->ddG,pDVar13,pDVar9);
      if (iVar3 != 0) {
        pDVar8 = p->ddG;
LAB_006935b9:
        Cudd_RecursiveDeref(pDVar8,pDVar13);
LAB_006935de:
        pDVar11 = (DdNode *)0x0;
        break;
      }
      local_84 = Cudd_DagSize(pDVar13);
      pDVar8 = p->ddG;
      if (p->pPars->nBddMax < (int)local_84) goto LAB_006935b9;
      n_01 = Cudd_bddAnd(pDVar8,pDVar13,(DdNode *)((ulong)pDVar9 ^ 1));
      if (n_01 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->ddG,pDVar13);
        Cudd_RecursiveDeref(p->ddG,pDVar9);
        pDVar9 = (DdNode *)0x0;
        goto LAB_006935de;
      }
      Cudd_Ref(n_01);
      pDVar11 = Extra_TransferPermute(p->ddG,p->dd,n_01,Permute_01);
      if (pDVar11 == (DdNode *)0x0) {
        pGVar14 = p->pPars;
        if (pGVar14->fSilent == 0) {
          printf("Reached timeout (%d seconds) during image computation in transfer 2.\n",
                 (ulong)(uint)pGVar14->TimeLimit);
          pGVar14 = p->pPars;
        }
        pGVar14->iFrame = uVar20;
        pDVar8 = p->ddG;
        goto LAB_006937d3;
      }
      Cudd_Ref(pDVar11);
      Cudd_RecursiveDeref(p->ddG,n_01);
      n_02 = Cudd_bddOr(p->ddG,pDVar9,pDVar13);
      if (n_02 == (DdNode *)0x0) {
        Cudd_RecursiveDeref(p->ddG,pDVar9);
        Cudd_RecursiveDeref(p->ddG,pDVar13);
        pDVar9 = (DdNode *)0x0;
        break;
      }
      Cudd_Ref(n_02);
      Cudd_RecursiveDeref(p->ddG,pDVar9);
      Cudd_RecursiveDeref(p->ddG,pDVar13);
      pDVar9 = n_02;
      n_01 = pDVar11;
      uVar20 = uVar16;
      if (p->pPars->fVerbose != 0) {
        fprintf(_stdout,"F =%5d : ",(ulong)uVar16);
        fprintf(_stdout,"Im =%6d  ",(ulong)local_84);
        pFVar2 = _stdout;
        uVar16 = Cudd_ReadReorderings(p->dd);
        uVar4 = Cudd_ReadGarbageCollections(p->dd);
        fprintf(pFVar2,"(%4d %3d)   ",(ulong)uVar16,(ulong)uVar4);
        pFVar2 = _stdout;
        uVar16 = Cudd_DagSize(n_02);
        fprintf(pFVar2,"Rea =%6d  ",(ulong)uVar16);
        pFVar2 = _stdout;
        uVar16 = Cudd_ReadReorderings(p->ddG);
        uVar4 = Cudd_ReadGarbageCollections(p->ddG);
        pcVar18 = "(%4d%4d)   ";
        fprintf(pFVar2,"(%4d%4d)   ",(ulong)uVar16,(ulong)uVar4);
        aVar10 = Abc_Clock();
        Abc_PrintTime((int)aVar10 - (int)aVar6,pcVar18,time);
      }
    }
    Cudd_RecursiveDeref(p->dd,n);
    Cudd_RecursiveDeref(p->dd,n_00);
    if (pDVar9 == (DdNode *)0x0) {
      p->pPars->iFrame = uVar20;
      return 0;
    }
    if (pDVar11 != (DdNode *)0x0) {
      Cudd_RecursiveDeref(p->dd,pDVar11);
    }
    pGVar14 = p->pPars;
    if (pGVar14->fVerbose != 0) {
      dVar21 = Cudd_CountMinterm(p->ddG,pDVar9,p->pAig->nRegs);
      if ((int)uVar16 < p->pPars->nIterMax) {
        pcVar18 = "Reachability analysis completed after %d frames.\n";
        if (p->pPars->nBddMax < (int)local_84) {
          pcVar18 = "Reachability analysis is stopped after %d frames.\n";
        }
      }
      else {
        pcVar18 = "Reachability analysis is stopped after %d frames.\n";
      }
      fprintf(_stdout,pcVar18,(ulong)uVar16);
      pFVar2 = _stdout;
      dVar22 = ldexp(1.0,p->pAig->nRegs);
      fprintf(pFVar2,"Reachable states = %.0f. (Ratio = %.4f %%)\n",dVar21,(dVar21 * 100.0) / dVar22
             );
      fflush(_stdout);
      pGVar14 = p->pPars;
    }
    iVar3 = pGVar14->nIterMax;
    if (((int)uVar16 < iVar3) && ((int)local_84 <= pGVar14->nBddMax)) {
      pDVar8 = p->ddG;
      if (pddGlo == (DdManager **)0x0) {
        Cudd_RecursiveDeref(pDVar8,pDVar9);
      }
      else {
        if (pDVar8->bFunc != (DdNode *)0x0) {
          __assert_fail("p->ddG->bFunc == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x375,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
        }
        pDVar8->bFunc = pDVar9;
        if (*pddGlo != (DdManager *)0x0) {
          __assert_fail("*pddGlo == NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bdd/llb/llb1Reach.c"
                        ,0x377,"int Llb_ManReachability(Llb_Man_t *, Vec_Int_t *, DdManager **)");
        }
        *pddGlo = pDVar8;
        p->ddG = (DdManager *)0x0;
      }
      pGVar14 = p->pPars;
      if (pGVar14->fSilent == 0) {
        printf("The miter is proved unreachable after %d iterations.  ",(ulong)uVar16);
        pGVar14 = p->pPars;
      }
      pGVar14->iFrame = uVar20;
      return 1;
    }
    if (pGVar14->fSilent == 0) {
      printf("Verified only for states reachable in %d frames.  ",(ulong)uVar16);
      pGVar14 = p->pPars;
      iVar3 = pGVar14->nIterMax;
    }
    pGVar14->iFrame = iVar3;
LAB_006937f4:
    Cudd_RecursiveDeref(p->ddG,pDVar9);
  }
  return -1;
}

Assistant:

int Llb_ManReachability( Llb_Man_t * p, Vec_Int_t * vHints, DdManager ** pddGlo )
{
    int * pNs2Glo = Vec_IntArray( p->vNs2Glo );
    int * pCs2Glo = Vec_IntArray( p->vCs2Glo );
    int * pGlo2Cs = Vec_IntArray( p->vGlo2Cs );
    DdNode * bCurrent, * bReached, * bNext, * bTemp, * bCube;
    DdNode * bConstrCs, * bConstrNs;
    abctime clk2, clk = Abc_Clock();
    int nIters, nBddSize = 0;
//    int nThreshold = 10000;

    // compute time to stop
    p->pPars->TimeTarget = p->pPars->TimeLimit ? p->pPars->TimeLimit * CLOCKS_PER_SEC + Abc_Clock(): 0;

    // define variable limits
    Llb_ManPrepareVarLimits( p );

    // start the managers
    assert( p->dd == NULL );
    assert( p->ddG == NULL );
    assert( p->ddR == NULL );
    p->dd  = Cudd_Init( Vec_IntSize(p->vVar2Obj), 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    p->ddR = Cudd_Init( Aig_ManCiNum(p->pAig),    0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );
    if ( pddGlo && *pddGlo )
        p->ddG = *pddGlo, *pddGlo = NULL; 
    else
        p->ddG = Cudd_Init( Aig_ManRegNum(p->pAig),   0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    if ( p->pPars->fReorder )
    {
        Cudd_AutodynEnable( p->dd,  CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddG, CUDD_REORDER_SYMM_SIFT );
        Cudd_AutodynEnable( p->ddR, CUDD_REORDER_SYMM_SIFT );
    }
    else
    {
        Cudd_AutodynDisable( p->dd );
        Cudd_AutodynDisable( p->ddG );
        Cudd_AutodynDisable( p->ddR );
    }

    // set the stop time parameter
    p->dd->TimeStop  = p->pPars->TimeTarget;
    p->ddG->TimeStop = p->pPars->TimeTarget;
    p->ddR->TimeStop = p->pPars->TimeTarget;

    // create bad state in the ring manager
    p->ddR->bFunc  = Llb_BddComputeBad( p->pAigGlo, p->ddR, p->pPars->TimeTarget );          
    if ( p->ddR->bFunc == NULL )
    {
        if ( !p->pPars->fSilent )
            printf( "Reached timeout (%d seconds) during constructing the bad states.\n", p->pPars->TimeLimit );
        p->pPars->iFrame = -1;
        return -1;
    }
    Cudd_Ref( p->ddR->bFunc );

    // derive constraints
    bConstrCs = Llb_ManCreateConstraints( p, vHints, 0 );   Cudd_Ref( bConstrCs );
    bConstrNs = Llb_ManCreateConstraints( p, vHints, 1 );   Cudd_Ref( bConstrNs );
//Extra_bddPrint( p->dd, bConstrCs ); printf( "\n" );
//Extra_bddPrint( p->dd, bConstrNs ); printf( "\n" );

    // perform reachability analysis
    // compute the starting set of states
    if ( p->ddG->bFunc )
    {
        bReached = p->ddG->bFunc; p->ddG->bFunc = NULL;
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bReached, pGlo2Cs );    Cudd_Ref( bCurrent );
    }
    else
    {
        bReached = Llb_ManComputeInitState( p, p->ddG );                         Cudd_Ref( bReached );
        bCurrent = Llb_ManComputeInitState( p, p->dd  );                         Cudd_Ref( bCurrent );
    }
//Extra_bddPrintSupport( p->ddG, bReached ); printf( "\n" );
//Extra_bddPrintSupport( p->dd,  bCurrent ); printf( "\n" );

//Extra_bddPrintSupport( p->dd, bCurrent ); printf( "\n" );
    for ( nIters = 0; nIters < p->pPars->nIterMax; nIters++ )
    { 
        clk2 = Abc_Clock();
        // check the runtime limit
        if ( p->pPars->TimeLimit && Abc_Clock() > p->pPars->TimeTarget )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout during image computation (%d seconds).\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }

        // save the onion ring
        bTemp = Extra_TransferPermute( p->dd, p->ddR, bCurrent, pCs2Glo );
        if ( bTemp == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during ring transfer.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return -1;
        }
        Cudd_Ref( bTemp );
        Vec_PtrPush( p->vRings, bTemp );

        // check it for bad states
        if ( !p->pPars->fSkipOutCheck && !Cudd_bddLeq( p->ddR, bTemp, Cudd_Not(p->ddR->bFunc) ) ) 
        {
            assert( p->pAigGlo->pSeqModel == NULL );
            if ( !p->pPars->fBackward )
                p->pAigGlo->pSeqModel = Llb_ManReachDeriveCex( p ); 
            if ( !p->pPars->fSilent )
            {
                if ( !p->pPars->fBackward )
                    Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d.  ", p->pAigGlo->pSeqModel->iPo, p->pAigGlo->pName, p->pAigGlo->pName, nIters );
                else
                    Abc_Print( 1, "Output ??? of miter \"%s\" was asserted in frame %d (counter-example is not produced).  ", p->pAigGlo->pName, nIters );
                Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
            }
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );  bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs ); bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs ); bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );  bReached = NULL;
            return 0; 
        }

        // restrict reachable states using constraints
        if ( vHints )
        {
            bCurrent = Cudd_bddAnd( p->dd, bTemp = bCurrent, bConstrCs );                                Cudd_Ref( bCurrent );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }

        // quantify variables appearing only in the init state
        bCube    = Llb_ManConstructQuantCubeIntern( p, (Llb_Grp_t *)Vec_PtrEntry(p->vGroups,0), 0, 0 );  Cudd_Ref( bCube );
        bCurrent = Cudd_bddExistAbstract( p->dd, bTemp = bCurrent, bCube );                              Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->dd, bTemp );
        Cudd_RecursiveDeref( p->dd, bCube );

        // compute the next states
        bNext = Llb_ManComputeImage( p, bCurrent, 0 );
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bCurrent );   bCurrent = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bCurrent ); bCurrent = NULL;

        // restrict reachable states using constraints
        if ( vHints )
        {
            bNext = Cudd_bddAnd( p->dd, bTemp = bNext, bConstrNs );                Cudd_Ref( bNext );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
//Extra_bddPrintSupport( p->dd, bNext ); printf( "\n" );

        // remap these states into the current state vars
//        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    Cudd_Ref( bNext );
//        Cudd_RecursiveDeref( p->dd, bTemp );
//        bNext = Extra_TransferPermuteTime( p->dd, p->ddG, bTemp = bNext, pNs2Glo, p->pPars->TimeTarget );    
        bNext = Extra_TransferPermute( p->dd, p->ddG, bTemp = bNext, pNs2Glo );    
        if ( bNext == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 1.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->dd,  bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bNext );
        Cudd_RecursiveDeref( p->dd, bTemp );  


        // check if there are any new states
        if ( Cudd_bddLeq( p->ddG, bNext, bReached ) ) // implication = no new states
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // check the BDD size
        nBddSize = Cudd_DagSize(bNext);
        if ( nBddSize > p->pPars->nBddMax )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }

        // get the new states
        bCurrent = Cudd_bddAnd( p->ddG, bNext, Cudd_Not(bReached) );
        if ( bCurrent == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bNext );        bNext = NULL;
            Cudd_RecursiveDeref( p->ddG,  bReached );     bReached = NULL;
            break;
        }
        Cudd_Ref( bCurrent );
        // minimize the new states with the reached states
//        bCurrent = Cudd_bddConstrain( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) ); Cudd_Ref( bCurrent );
//        bCurrent = Cudd_bddRestrict( p->ddG, bTemp = bCurrent, Cudd_Not(bReached) );  Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//printf( "Initial BDD =%7d. Constrained BDD =%7d.\n", Cudd_DagSize(bTemp), Cudd_DagSize(bCurrent) );

        // remap these states into the current state vars
//        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );   Cudd_Ref( bCurrent );
//        Cudd_RecursiveDeref( p->ddG, bTemp );
//        bCurrent = Extra_TransferPermuteTime( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs, p->pPars->TimeTarget );    
        bCurrent = Extra_TransferPermute( p->ddG, p->dd, bTemp = bCurrent, pGlo2Cs );    
        if ( bCurrent == NULL )
        {
            if ( !p->pPars->fSilent )
                printf( "Reached timeout (%d seconds) during image computation in transfer 2.\n",  p->pPars->TimeLimit );
            p->pPars->iFrame = nIters - 1;
            Cudd_RecursiveDeref( p->ddG, bTemp );  
            Cudd_RecursiveDeref( p->dd,  bConstrCs );  bConstrCs = NULL;
            Cudd_RecursiveDeref( p->dd,  bConstrNs );  bConstrNs = NULL;
            Cudd_RecursiveDeref( p->ddG, bReached );   bReached = NULL;
            return -1;
        }
        Cudd_Ref( bCurrent );
        Cudd_RecursiveDeref( p->ddG, bTemp ); 
        

        // add to the reached states
        bReached = Cudd_bddOr( p->ddG, bTemp = bReached, bNext );                       
        if ( bReached == NULL )
        {
            Cudd_RecursiveDeref( p->ddG,  bTemp );     bTemp = NULL;
            Cudd_RecursiveDeref( p->ddG,  bNext );     bNext = NULL;
            break;
        }
        Cudd_Ref( bReached );
        Cudd_RecursiveDeref( p->ddG, bTemp );
        Cudd_RecursiveDeref( p->ddG, bNext );
        bNext = NULL;

        if ( p->pPars->fVerbose )
        {
            fprintf( stdout, "F =%5d : ",    nIters );
            fprintf( stdout, "Im =%6d  ",    nBddSize );
            fprintf( stdout, "(%4d %3d)   ", Cudd_ReadReorderings(p->dd),  Cudd_ReadGarbageCollections(p->dd) );
            fprintf( stdout, "Rea =%6d  ",   Cudd_DagSize(bReached) );
            fprintf( stdout, "(%4d%4d)   ",  Cudd_ReadReorderings(p->ddG), Cudd_ReadGarbageCollections(p->ddG) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk2 );
        }
/*
        if ( p->pPars->fVerbose )
        {
            double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
//            Extra_bddPrint( p->ddG, bReached );printf( "\n" );
            fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
            fflush( stdout ); 
        }
*/
    }
    Cudd_RecursiveDeref( p->dd, bConstrCs ); bConstrCs = NULL;
    Cudd_RecursiveDeref( p->dd, bConstrNs ); bConstrNs = NULL;
    if ( bReached == NULL )
    {
        p->pPars->iFrame = nIters - 1;
        return 0; // reachable
    }
//    assert( bCurrent == NULL );
    if ( bCurrent )
        Cudd_RecursiveDeref( p->dd, bCurrent );
    // report the stats
    if ( p->pPars->fVerbose )
    {
        double nMints = Cudd_CountMinterm(p->ddG, bReached, Saig_ManRegNum(p->pAig) );
        if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
            fprintf( stdout, "Reachability analysis is stopped after %d frames.\n", nIters );
        else
            fprintf( stdout, "Reachability analysis completed after %d frames.\n", nIters );
        fprintf( stdout, "Reachable states = %.0f. (Ratio = %.4f %%)\n", nMints, 100.0*nMints/pow(2.0, Saig_ManRegNum(p->pAig)) );
        fflush( stdout ); 
    }
    if ( nIters >= p->pPars->nIterMax || nBddSize > p->pPars->nBddMax )
    {
        if ( !p->pPars->fSilent )
            printf( "Verified only for states reachable in %d frames.  ", nIters );
        p->pPars->iFrame = p->pPars->nIterMax;
        Cudd_RecursiveDeref( p->ddG, bReached );
        return -1; // undecided
    }
    if ( pddGlo ) 
    {
        assert( p->ddG->bFunc == NULL );
        p->ddG->bFunc = bReached; bReached = NULL;
        assert( *pddGlo == NULL );
        *pddGlo = p->ddG;  p->ddG = NULL;
    }
    else
        Cudd_RecursiveDeref( p->ddG, bReached );
    if ( !p->pPars->fSilent )
        printf( "The miter is proved unreachable after %d iterations.  ", nIters );
    p->pPars->iFrame = nIters - 1;
    return 1; // unreachable
}